

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

var __thiscall cs::struct_builder::operator()(struct_builder *this)

{
  char *pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  struct_builder *psVar5;
  int iVar6;
  undefined4 extraout_var;
  type_t *ptVar7;
  undefined4 extraout_var_00;
  undefined *puVar8;
  structure *psVar9;
  domain_type *args_2;
  runtime_error *prVar10;
  element_type *peVar11;
  context_t *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  bool bVar14;
  var parent;
  var builder;
  scope_guard scope;
  undefined1 local_d8 [16];
  string local_c8;
  scope_guard local_a8;
  context_t *local_a0;
  struct_builder *local_98;
  
  local_a8.context = in_RSI;
  domain_manager::add_domain
            (&(((((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_runtime_type).storage);
  peVar11 = in_RSI[4].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar11 == (element_type *)0x0) {
LAB_001d7afd:
    p_Var12 = in_RSI[5].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    p_Var3 = in_RSI[7].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    local_a0 = in_RSI;
    local_98 = this;
    if (p_Var12 != p_Var3) {
      p_Var13 = in_RSI[6].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      peVar11 = in_RSI[7].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      do {
        puVar8 = current_process;
        pp_Var4 = p_Var12->_vptr__Sp_counted_base;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar8 + 0xd0),(void *)0x0);
        }
        (**(code **)(*pp_Var4 + 0x18))(pp_Var4);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var12->_M_use_count;
        if (p_Var12 == p_Var13) {
          p_Var12 = (peVar11->compiler).
                    super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          peVar11 = (element_type *)
                    &(peVar11->compiler).
                     super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          p_Var13 = p_Var12 + 0x20;
        }
      } while (p_Var12 != p_Var3);
    }
    args_2 = domain_manager::get_domain
                       (&((((((local_a8.context)->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->super_runtime_type).storage);
    psVar5 = local_98;
    cs_impl::any::make<cs::structure,cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
              ((any *)local_98,(type_id *)(local_a0 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 2),
               args_2);
    scope_guard::~scope_guard(&local_a8);
    return (var)(proxy *)psVar5;
  }
  local_c8._M_dataplus._M_p = (pointer)peVar11;
  runtime_type::parse_expr
            ((runtime_type *)(local_d8 + 8),
             (iterator *)
             (((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_c8,0));
  if (local_d8._8_8_ == 0) {
    puVar8 = &void::typeinfo;
  }
  else {
    iVar6 = (**(code **)(**(long **)(local_d8._8_8_ + 0x10) + 0x10))();
    puVar8 = (undefined *)CONCAT44(extraout_var,iVar6);
  }
  pcVar1 = *(char **)(puVar8 + 8);
  if (pcVar1 != "N2cs6type_tE") {
    if (*pcVar1 == '*') {
LAB_001d7c14:
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Target is not a type.","");
      runtime_error::runtime_error(prVar10,&local_c8);
      __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    iVar6 = strcmp(pcVar1,"N2cs6type_tE");
    if (iVar6 != 0) goto LAB_001d7c14;
  }
  ptVar7 = cs_impl::any::const_val<cs::type_t>((any *)(local_d8 + 8));
  if (&ptVar7->id != (type_id *)(in_RSI + 1)) {
    p_Var12 = in_RSI[1].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar14 = std::type_index::operator==((type_index *)(in_RSI + 1),&(ptVar7->id).type_idx);
    }
    else {
      bVar14 = p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ptVar7->id).type_hash;
    }
    if (bVar14 == false) {
      if ((ptVar7->constructor).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(ptVar7->constructor)._M_invoker)((_Any_data *)local_d8);
      if ((_func_void *)local_d8._0_8_ == (_func_void *)0x0) {
        puVar8 = &void::typeinfo;
      }
      else {
        iVar6 = (**(code **)(**(long **)(local_d8._0_8_ + 0x10) + 0x10))();
        puVar8 = (undefined *)CONCAT44(extraout_var_00,iVar6);
      }
      pcVar1 = *(char **)(puVar8 + 8);
      if (pcVar1 != "N2cs9structureE") {
        if (*pcVar1 == '*') {
LAB_001d7c6a:
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"Target is not a struct.","");
          runtime_error::runtime_error(prVar10,&local_c8);
          __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        iVar6 = strcmp(pcVar1,"N2cs9structureE");
        if (iVar6 != 0) goto LAB_001d7c6a;
      }
      cs_impl::any::protect((any *)local_d8);
      peVar2 = (((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar9 = cs_impl::any::const_val<cs::structure>((any *)local_d8);
      domain_manager::involve_domain
                (&(peVar2->super_runtime_type).storage,
                 (psVar9->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,false);
      domain_manager::add_var_no_return<char_const(&)[7]>
                (&(((((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage,(char (*) [7])"parent",(var *)local_d8,true);
      cs_impl::any::recycle((any *)local_d8);
      cs_impl::any::recycle((any *)(local_d8 + 8));
      goto LAB_001d7afd;
    }
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Can not inherit itself.","");
  runtime_error::runtime_error(prVar10,&local_c8);
  __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var struct_builder::operator()()
	{
		scope_guard scope(mContext);
		if (mParent.root().usable()) {
			var builder = mContext->instance->parse_expr(mParent.root());
			if (builder.type() == typeid(type_t)) {
				const auto &t = builder.const_val<type_t>();
				if (mTypeId == t.id)
					throw runtime_error("Can not inherit itself.");
				var parent = t.constructor();
				if (parent.type() == typeid(structure)) {
					parent.protect();
					mContext->instance->storage.involve_domain(parent.const_val<structure>().get_domain());
					mContext->instance->storage.add_var_no_return("parent", parent, true);
				}
				else
					throw runtime_error("Target is not a struct.");
			}
			else
				throw runtime_error("Target is not a type.");
		}
		for (auto &ptr: this->mMethod) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		return var::make<structure>(this->mTypeId, this->mName, scope.get());
	}